

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

LogLevels helics::logLevelFromString(string_view level)

{
  int iVar1;
  LogLevels LVar2;
  const_iterator cVar3;
  char *in_RSI;
  ulong in_RDI;
  string_view V;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  key_type local_30;
  
  local_40._M_len = in_RDI;
  local_40._M_str = in_RSI;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,in_RSI,in_RSI + in_RDI);
  cVar3 = CLI::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)gLogLevelMap_abi_cxx11_,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_40,0,9,"loglevel_");
    LVar2 = 0xfff0bdc1;
    if (iVar1 == 0) {
      if (local_40._M_len < 9) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",9)
        ;
      }
      V._M_len = local_40._M_str + 9;
      V._M_str = (char *)0xfff0bdc1;
      LVar2 = gmlc::utilities::numeric_conversion<int>
                        ((utilities *)(local_40._M_len - 9),V,
                         (int)(utilities *)(local_40._M_len - 9));
    }
  }
  else {
    LVar2 = *(LogLevels *)
             ((long)cVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                    ._M_cur + 0x28);
  }
  return LVar2;
}

Assistant:

LogLevels logLevelFromString(std::string_view level)
{
    auto res = gLogLevelMap.find(std::string(level));
    if (res != gLogLevelMap.end()) {
        return static_cast<LogLevels>(res->second);
    }
    if (level.compare(0, 9, "loglevel_") == 0) {
        return static_cast<LogLevels>(
            gmlc::utilities::numeric_conversion<int>(level.substr(9), -999999));
    } else {
        return static_cast<LogLevels>(-999999);
    }
}